

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O2

int __thiscall QTreeView::verticalOffset(QTreeView *this)

{
  QTreeViewPrivate *this_00;
  long lVar1;
  int iVar2;
  int iVar3;
  QScrollBar *pQVar4;
  P _a;
  int item;
  int iVar5;
  long lVar6;
  
  this_00 = *(QTreeViewPrivate **)
             &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
              field_0x8;
  if ((this_00->super_QAbstractItemViewPrivate).verticalScrollMode != ScrollPerItem) {
    pQVar4 = QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)this);
    iVar2 = QAbstractSlider::value(&pQVar4->super_QAbstractSlider);
    return iVar2;
  }
  if (this_00->uniformRowHeights == true) {
    pQVar4 = QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)this);
    iVar2 = QAbstractSlider::value(&pQVar4->super_QAbstractSlider);
    iVar2 = iVar2 * this_00->defaultItemHeight;
  }
  else {
    QAbstractItemViewPrivate::executePostedLayout(&this_00->super_QAbstractItemViewPrivate);
    lVar1 = (this_00->viewItems).d.size;
    pQVar4 = QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)this);
    iVar2 = QAbstractSlider::value(&pQVar4->super_QAbstractSlider);
    lVar6 = (long)iVar2;
    if (lVar1 < iVar2) {
      lVar6 = lVar1;
    }
    iVar2 = 0;
    iVar5 = (int)lVar6;
    if (iVar5 < 1) {
      iVar5 = 0;
    }
    for (item = 0; iVar5 != item; item = item + 1) {
      iVar3 = QTreeViewPrivate::itemHeight(this_00,item);
      iVar2 = iVar2 + iVar3;
    }
  }
  return iVar2;
}

Assistant:

int QTreeView::verticalOffset() const
{
    Q_D(const QTreeView);
    if (d->verticalScrollMode == QAbstractItemView::ScrollPerItem) {
        if (d->uniformRowHeights)
            return verticalScrollBar()->value() * d->defaultItemHeight;
        // If we are scrolling per item and have non-uniform row heights,
        // finding the vertical offset in pixels is going to be relatively slow.
        // ### find a faster way to do this
        d->executePostedLayout();
        int offset = 0;
        const int cnt = qMin(d->viewItems.size(), verticalScrollBar()->value());
        for (int i = 0; i < cnt; ++i)
            offset += d->itemHeight(i);
        return offset;
    }
    // scroll per pixel
    return verticalScrollBar()->value();
}